

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O2

void PrefOpSize(PDISASM pMyDisasm)

{
  Int32 *pIVar1;
  UInt8 UVar2;
  Int32 IVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  _func_void_PDISASM **pp_Var7;
  
  iVar4 = Security(2,pMyDisasm);
  if (iVar4 == 0) {
    return;
  }
  (pMyDisasm->Prefix).OperandSize = '\x01';
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  ResetREX(pMyDisasm);
  pbVar5 = (byte *)((pMyDisasm->Reserved_).EIP_ + 1);
  (pMyDisasm->Reserved_).EIP_ = (UIntPtr)pbVar5;
  (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
  pIVar1 = &(pMyDisasm->Reserved_).NB_PREFIX;
  *pIVar1 = *pIVar1 + 1;
  iVar4 = (pMyDisasm->Reserved_).OperandSize;
  (pMyDisasm->Reserved_).OriginalOperandSize = iVar4;
  if ((pMyDisasm->Reserved_).Architecture == 0x10) {
    IVar3 = 0x20;
LAB_0010c747:
    (pMyDisasm->Reserved_).OperandSize = IVar3;
  }
  else if (iVar4 != 0x40) {
    IVar3 = 0x10;
    goto LAB_0010c747;
  }
  (pMyDisasm->Instruction).Opcode = (uint)*pbVar5;
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    UVar2 = (pMyDisasm->Reserved_).VEX.mmmmm;
    if (UVar2 == '\x03') {
      uVar6 = (ulong)*pbVar5;
      pp_Var7 = opcode_map4;
    }
    else if (UVar2 == '\x02') {
      uVar6 = (ulong)*pbVar5;
      pp_Var7 = opcode_map3;
    }
    else {
      if (UVar2 != '\x01') {
        failDecode(pMyDisasm);
        goto LAB_0010c78f;
      }
      uVar6 = (ulong)*pbVar5;
      pp_Var7 = opcode_map2;
    }
  }
  else {
    uVar6 = (ulong)*pbVar5;
    pp_Var7 = opcode_map1;
  }
  (*pp_Var7[uVar6])(pMyDisasm);
LAB_0010c78f:
  (pMyDisasm->Reserved_).OperandSize =
       (uint)((pMyDisasm->Reserved_).Architecture != 0x10) * 0x10 + 0x10;
  return;
}

Assistant:

void __bea_callspec__ PrefOpSize(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    pMyDisasm->Prefix.OperandSize = InUsePrefix;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    GV.OriginalOperandSize = GV.OperandSize;  /* if GV.OperandSize is used as a mandatory prefix, keep the real operandsize value */
    if (GV.Architecture == 16) {
        GV.OperandSize = 32;
    }
    else {
        if (GV.OperandSize != 64) {
            GV.OperandSize = 16;
        }
    }
    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    if (GV.VEX.state != InUsePrefix) {
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x1) {
        (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x2) {
        (void) opcode_map3[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x3) {
        (void) opcode_map4[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else {
        failDecode(pMyDisasm);
    }
    if (GV.Architecture == 16) {
        GV.OperandSize = 16;
    }
    else {
        GV.OperandSize = 32;
    }
}